

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version_set.cc
# Opt level: O0

double leveldb::MaxBytesForLevel(Options *options,int level)

{
  undefined8 local_20;
  double result;
  int level_local;
  Options *options_local;
  
  local_20 = 10485760.0;
  for (result._4_4_ = level; 1 < result._4_4_; result._4_4_ = result._4_4_ + -1) {
    local_20 = local_20 * 10.0;
  }
  return local_20;
}

Assistant:

static double MaxBytesForLevel(const Options* options, int level) {
  // Note: the result for level zero is not really used since we set
  // the level-0 compaction threshold based on number of files.

  // Result for both level-0 and level-1
  double result = 10. * 1048576.0;
  while (level > 1) {
    result *= 10;
    level--;
  }
  return result;
}